

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O0

void __thiscall
cmSourceGroup::cmSourceGroup(cmSourceGroup *this,string *name,char *regex,char *parentName)

{
  cmAlphaNum local_c0;
  cmAlphaNum local_90;
  string local_60;
  unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_> local_40 [3];
  char *local_28;
  char *parentName_local;
  char *regex_local;
  string *name_local;
  cmSourceGroup *this_local;
  
  local_28 = parentName;
  parentName_local = regex;
  regex_local = (char *)name;
  name_local = &this->Name;
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->FullName);
  cmsys::RegularExpression::RegularExpression(&this->GroupRegex);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->GroupFiles);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            (&this->SourceFiles);
  std::unique_ptr<cmSourceGroupInternals,std::default_delete<cmSourceGroupInternals>>::
  unique_ptr<std::default_delete<cmSourceGroupInternals>,void>
            ((unique_ptr<cmSourceGroupInternals,std::default_delete<cmSourceGroupInternals>> *)
             &this->Internal);
  std::make_unique<cmSourceGroupInternals>();
  std::unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>::operator=
            (&this->Internal,local_40);
  std::unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>::~unique_ptr
            (local_40);
  SetGroupRegex(this,parentName_local);
  if (local_28 != (char *)0x0) {
    cmAlphaNum::cmAlphaNum(&local_90,local_28);
    cmAlphaNum::cmAlphaNum(&local_c0,'\\');
    cmStrCat<>(&local_60,&local_90,&local_c0);
    std::__cxx11::string::operator=((string *)&this->FullName,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::operator+=((string *)&this->FullName,(string *)this);
  return;
}

Assistant:

cmSourceGroup::cmSourceGroup(std::string name, const char* regex,
                             const char* parentName)
  : Name(std::move(name))
{
  this->Internal = cm::make_unique<cmSourceGroupInternals>();
  this->SetGroupRegex(regex);
  if (parentName) {
    this->FullName = cmStrCat(parentName, '\\');
  }
  this->FullName += this->Name;
}